

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

t_int * voutlet_perform(t_int *w)

{
  long lVar1;
  int iVar2;
  float *pfVar3;
  t_sample *ptVar4;
  t_sample *local_38;
  t_sample *outwas;
  t_sample *out;
  float *pfStack_20;
  int n;
  t_sample *in;
  t_voutlet *x;
  t_int *w_local;
  
  lVar1 = w[1];
  local_38 = *(t_sample **)(lVar1 + 0x60);
  outwas = local_38;
  out._4_4_ = (int)w[3];
  pfStack_20 = (float *)w[2];
  while (iVar2 = out._4_4_ + -1, out._4_4_ != 0) {
    pfVar3 = pfStack_20 + 1;
    ptVar4 = outwas + 1;
    *outwas = *pfStack_20 + *outwas;
    outwas = ptVar4;
    out._4_4_ = iVar2;
    pfStack_20 = pfVar3;
    if (ptVar4 == *(t_sample **)(lVar1 + 0x50)) {
      outwas = *(t_sample **)(lVar1 + 0x48);
    }
  }
  local_38 = local_38 + *(int *)(lVar1 + 0x68);
  if (*(t_sample **)(lVar1 + 0x50) <= local_38) {
    local_38 = *(t_sample **)(lVar1 + 0x48);
  }
  *(t_sample **)(lVar1 + 0x60) = local_38;
  return w + 4;
}

Assistant:

t_int *voutlet_perform(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_write, *outwas = out;
    while (n--)
    {
        *out++ += *in++;
        if (out == x->x_endbuf) out = x->x_buf;
    }
    outwas += x->x_hop;
    if (outwas >= x->x_endbuf) outwas = x->x_buf;
    x->x_write = outwas;
    return (w+4);
}